

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O2

int __thiscall AC3Codec::decodeFrame(AC3Codec *this,uint8_t *buf,uint8_t *end,int *skipBytes)

{
  uint uVar1;
  uint8_t *buffer;
  bool bVar2;
  byte bVar3;
  AC3ParseError AVar4;
  byte *buf_00;
  int iVar5;
  ulong uVar6;
  
  if ((long)end - (long)buf < 2) {
    return -10;
  }
  if (this->m_state != stateDecodeAC3) {
    iVar5 = 0;
    if ((*buf != '\v') || (buf[1] != 'w')) goto LAB_0018cada;
    bVar2 = testDecodeTestFrame(this,buf,end);
    if (bVar2) {
      this->m_state = stateDecodeAC3;
    }
    else {
      iVar5 = 0;
      if (this->m_state != stateDecodeAC3) goto LAB_0018cada;
    }
  }
  *skipBytes = 0;
  AVar4 = parseHeader(this,buf,end);
  if (AVar4 == NOT_ENOUGH_BUFFER) {
    return -10;
  }
  if (AVar4 != NO_ERROR) {
    return 0;
  }
  this->m_frameDuration = ((long)this->m_samples * 0x13b6d8300) / (long)this->m_sample_rate;
  iVar5 = this->m_frame_size;
LAB_0018cada:
  bVar3 = this->m_true_hd_mode;
  if ((this->m_testMode == true) && ((bVar3 & 1) == 0)) {
    buffer = buf + iVar5;
    if ((long)end - (long)buffer < 8) {
      return -10;
    }
    if (((*buffer != '\v') || (buffer[1] != 'w')) && (bVar2 = isHDSyncWord(buffer + 4), bVar2)) {
      if ((ulong)((long)end - (long)buffer) < 0x15) {
        return -10;
      }
      bVar3 = MLPCodec::decodeFrame(&this->mlp,buffer,buffer + 0x15);
      this->m_true_hd_mode = (bool)bVar3;
    }
  }
  if ((bVar3 & 1) == 0) {
    if (this->m_downconvertToAC3 != true) {
      return iVar5;
    }
    if (this->m_bsid < 0xb) {
      return iVar5;
    }
    *skipBytes = iVar5;
  }
  else {
    buf_00 = buf + iVar5;
    if ((long)end - (long)buf_00 < 7) {
      return -10;
    }
    if (this->m_state == stateDecodeAC3) {
      if (((*buf_00 == 0xb) && (buf_00[1] == 0x77)) &&
         (bVar2 = testDecodeTestFrame(this,buf_00,end), bVar2)) {
        return iVar5;
      }
      this->m_waitMoreData = true;
      this->m_state = stateDecodeTrueHDFirst;
      return iVar5;
    }
    this->m_state = stateDecodeTrueHD;
    uVar1 = (*buf_00 & 0xf) * 0x200 + (uint)buf_00[1] * 2;
    uVar6 = (ulong)uVar1;
    if ((ulong)((long)end - (long)buf_00) < uVar6) {
      return -10;
    }
    if (((buf_00[uVar6] == 0xb) && ((buf_00 + uVar6)[1] == 0x77)) &&
       (bVar2 = testDecodeTestFrame(this,buf_00 + uVar6,end), bVar2)) {
      this->m_waitMoreData = false;
    }
    if (this->m_downconvertToAC3 != true) {
      return uVar1;
    }
    *skipBytes = uVar1;
  }
  return 0;
}

Assistant:

int AC3Codec::decodeFrame(uint8_t *buf, uint8_t *end, int &skipBytes)
{
    try
    {
        int rez = 0;

        if (end - buf < 2)
            return NOT_ENOUGH_BUFFER;
        if (m_state != AC3State::stateDecodeAC3 && buf[0] == 0x0B && buf[1] == 0x77)
        {
            if (testDecodeTestFrame(buf, end))
                m_state = AC3State::stateDecodeAC3;
        }

        if (m_state == AC3State::stateDecodeAC3)
        {
            skipBytes = 0;
            const AC3ParseError err = parseHeader(buf, end);

            if (err == AC3ParseError::NOT_ENOUGH_BUFFER)
                return NOT_ENOUGH_BUFFER;

            if (err != AC3ParseError::NO_ERROR)
                return 0;  // parse error

            m_frameDuration = (INTERNAL_PTS_FREQ * m_samples) / m_sample_rate;
            rez = m_frame_size;
        }

        if (getTestMode() && !m_true_hd_mode)
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 8)
                return NOT_ENOUGH_BUFFER;
            if (!isSyncWord(trueHDData) && isHDSyncWord(trueHDData + 4))
            {
                if (end - trueHDData < 21)
                    return NOT_ENOUGH_BUFFER;
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + 21);
            }
        }

        if ((m_true_hd_mode))  // omit AC3+
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 7)
                return NOT_ENOUGH_BUFFER;
            if (m_state == AC3State::stateDecodeAC3)
            {
                // check if it is a real HD frame

                if (trueHDData[0] != 0x0B || trueHDData[1] != 0x77 || !testDecodeTestFrame(trueHDData, end))
                {
                    m_waitMoreData = true;
                    m_state = AC3State::stateDecodeTrueHDFirst;
                }
                return rez;
            }
            m_state = AC3State::stateDecodeTrueHD;
            int trueHDFrameLen = (trueHDData[0] & 0x0f) << 8;
            trueHDFrameLen += trueHDData[1];
            trueHDFrameLen *= 2;
            if (end - trueHDData < static_cast<int64_t>(trueHDFrameLen))
                return NOT_ENOUGH_BUFFER;
            if (!m_true_hd_mode)
            {
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + trueHDFrameLen);
            }
            uint8_t *nextFrame = trueHDData + trueHDFrameLen;

            if (nextFrame[0] == 0x0B && nextFrame[1] == 0x77 && testDecodeTestFrame(nextFrame, end))
                m_waitMoreData = false;

            if (m_downconvertToAC3)
            {
                skipBytes = trueHDFrameLen;
                return 0;
            }
            return trueHDFrameLen;
        }
        if (m_downconvertToAC3 && m_bsid > 10)
        {
            skipBytes = rez;  // skip E-AC3 frame
            return 0;
        }
        return rez;
    }
    catch (BitStreamException &)
    {
        return NOT_ENOUGH_BUFFER;
    }
}